

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::anon_unknown_0::ImageLoadStoreEarlyFragmentTestsTest::isTextureFilledWithValue
          (ImageLoadStoreEarlyFragmentTestsTest *this,GLfloat value)

{
  CallLogWrapper *this_00;
  ostringstream *this_01;
  float fVar1;
  long lVar2;
  GLenum err;
  MessageBuilder *this_02;
  long lVar3;
  ulong uVar4;
  long lVar5;
  undefined1 local_1b0 [384];
  
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glGetTexImage
            (this_00,0xde1,0,0x1903,0x1406,
             (this->m_extracted_texture_data).super__Vector_base<float,_std::allocator<float>_>.
             _M_impl.super__Vector_impl_data._M_start);
  err = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(err,"GetTexImage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x2775);
  uVar4 = (ulong)(this->m_image_edge * this->m_image_edge);
  lVar3 = -4;
  lVar2 = 0;
  do {
    lVar5 = lVar2;
    if (-lVar5 == uVar4) goto LAB_00a638c5;
    fVar1 = *(float *)((long)(this->m_extracted_texture_data).
                             super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar3 + 4);
    lVar3 = lVar3 + 4;
  } while ((fVar1 == value) && (lVar2 = lVar5 + -1, !NAN(fVar1) && !NAN(value)));
  local_1b0._0_8_ =
       ((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
       m_testCtx->m_log;
  this_01 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_01);
  std::operator<<((ostream *)this_01,"Texel at location ");
  std::ostream::_M_insert<unsigned_long>((ulong)this_01);
  std::operator<<((ostream *)this_01," has invalid value: ");
  this_02 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,
                       (float *)(lVar3 + (long)(this->m_extracted_texture_data).
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data._M_start));
  std::operator<<(&(this_02->m_str).super_basic_ostream<char,_std::char_traits<char>_>," expected: "
                 );
  std::ostream::operator<<(&this_02->m_str,value);
  tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_01);
LAB_00a638c5:
  return uVar4 <= (ulong)-lVar5;
}

Assistant:

bool isTextureFilledWithValue(GLfloat value)
	{
		glGetTexImage(GL_TEXTURE_2D, 0, GL_RED, GL_FLOAT, &m_extracted_texture_data[0]);
		GLU_EXPECT_NO_ERROR(glGetError(), "GetTexImage");

		for (GLuint i = 0; i < m_image_edge * m_image_edge; ++i)
		{
			if (value != m_extracted_texture_data[i])
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Texel at location " << i
													<< " has invalid value: " << m_extracted_texture_data[i]
													<< " expected: " << value << tcu::TestLog::EndMessage;

				return false;
			}
		}

		return true;
	}